

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  Instruction **ppIVar1;
  Value *pVVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  lua_CFunction p_Var6;
  uint uVar7;
  Value VVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  TValue *pTVar12;
  StkId pTVar13;
  CallInfo *pCVar14;
  uint uVar15;
  TValue *io1;
  StkId pTVar16;
  long lVar17;
  ulong uVar18;
  TValue *io1_1;
  
  while( true ) {
    uVar10 = func->tt_ & 0x3f;
    if (uVar10 == 6) {
      lVar5 = *(long *)((func->value_).f + 0x18);
      uVar18 = (long)L->top - (long)func;
      bVar3 = *(byte *)(lVar5 + 0xc);
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)bVar3) {
        pTVar13 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,(uint)bVar3);
        func = (StkId)(((long)func - (long)pTVar13) + (long)L->stack);
      }
      bVar4 = *(byte *)(lVar5 + 10);
      uVar10 = (uint)bVar4;
      iVar11 = (int)(uVar18 >> 4);
      if (*(char *)(lVar5 + 0xb) == '\0') {
        if (iVar11 <= (int)uVar10) {
          pTVar13 = L->top;
          iVar11 = (uVar10 - iVar11) + 1;
          do {
            pTVar13->tt_ = 0;
            pTVar13 = pTVar13 + 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          L->top = pTVar13;
        }
        pTVar13 = func + 1;
      }
      else {
        pTVar13 = L->top;
        uVar15 = 0;
        if ((1 < iVar11) && (uVar15 = 0, bVar4 != 0)) {
          uVar7 = iVar11 - 2U;
          if (bVar4 - 1 <= iVar11 - 2U) {
            uVar7 = bVar4 - 1;
          }
          uVar15 = uVar7 + 1;
          lVar17 = 0;
          do {
            pTVar16 = L->top;
            L->top = pTVar16 + 1;
            pVVar2 = (Value *)((long)&pTVar13[-(long)(iVar11 + -1)].value_ + lVar17);
            VVar8 = pVVar2[1];
            pTVar16->value_ = *pVVar2;
            *(Value *)&pTVar16->tt_ = VVar8;
            *(undefined4 *)((long)&pTVar13[-(long)(iVar11 + -1)].tt_ + lVar17) = 0;
            lVar17 = lVar17 + 0x10;
          } while ((ulong)uVar7 * 0x10 + 0x10 != lVar17);
        }
        iVar11 = uVar10 - uVar15;
        if (uVar15 <= uVar10 && iVar11 != 0) {
          pTVar16 = L->top;
          do {
            pTVar16->tt_ = 0;
            pTVar16 = pTVar16 + 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          L->top = pTVar16;
        }
      }
      pCVar14 = L->ci->next;
      if (pCVar14 == (CallInfo *)0x0) {
        pCVar14 = luaE_extendCI(L);
      }
      L->ci = pCVar14;
      pCVar14->nresults = (short)nresults;
      pCVar14->func = func;
      (pCVar14->u).l.base = pTVar13;
      pCVar14->top = pTVar13 + bVar3;
      L->top = pTVar13 + bVar3;
      lVar5 = *(long *)(lVar5 + 0x38);
      (pCVar14->u).c.old_errfunc = lVar5;
      pCVar14->callstatus = 2;
      if ((L->hookmask & 1) != 0) {
        (pCVar14->u).l.savedpc = (Instruction *)(lVar5 + 4);
        iVar11 = 0;
        if (((pCVar14->previous->callstatus & 2) != 0) &&
           ((*(uint *)((pCVar14->previous->u).c.old_errfunc + -4) & 0x3f) == 0x25)) {
          pCVar14->callstatus = 0x22;
          iVar11 = 4;
        }
        luaD_hook(L,iVar11,-1);
        ppIVar1 = &(pCVar14->u).l.savedpc;
        *ppIVar1 = *ppIVar1 + -1;
      }
      return 0;
    }
    pTVar13 = func;
    if (uVar10 == 0x16) break;
    if (uVar10 == 0x26) {
      pTVar13 = (StkId)((func->value_).f + 0x18);
      break;
    }
    if ((long)L->stack_last - (long)L->top < 0x11) {
      pTVar13 = L->stack;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,1);
      func = (StkId)(((long)func - (long)pTVar13) + (long)L->stack);
    }
    pTVar12 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar12->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar13 = L->top;
    if (func < pTVar13) {
      do {
        iVar11 = pTVar13[-1].tt_;
        uVar9 = *(undefined4 *)&pTVar13[-1].field_0xc;
        pTVar13->value_ = pTVar13[-1].value_;
        pTVar13->tt_ = iVar11;
        *(undefined4 *)&pTVar13->field_0xc = uVar9;
        pTVar13 = pTVar13 + -1;
      } while (func < pTVar13);
      pTVar13 = L->top;
    }
    L->top = pTVar13 + 1;
    iVar11 = pTVar12->tt_;
    uVar9 = *(undefined4 *)&pTVar12->field_0xc;
    func->value_ = pTVar12->value_;
    func->tt_ = iVar11;
    *(undefined4 *)&func->field_0xc = uVar9;
  }
  p_Var6 = (pTVar13->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    pTVar13 = L->stack;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    luaD_growstack(L,0x14);
    func = (StkId)(((long)func - (long)pTVar13) + (long)L->stack);
  }
  pCVar14 = L->ci->next;
  if (pCVar14 == (CallInfo *)0x0) {
    pCVar14 = luaE_extendCI(L);
  }
  L->ci = pCVar14;
  pCVar14->nresults = (short)nresults;
  pCVar14->func = func;
  pCVar14->top = L->top + 0x14;
  pCVar14->callstatus = 0;
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar11 = (*p_Var6)(L);
  luaD_poscall(L,pCVar14,L->top + -(long)iVar11,iVar11);
  return 1;
}

Assistant:

int luaD_precall(lua_State *L, StkId func, int nresults) {
    lua_CFunction f;
    CallInfo *ci;
    switch (ttype(func)) {
        case LUA_TCCL:  /* C closure */
            f = clCvalue(func)->f;
            goto Cfunc;
        case LUA_TLCF:  /* light C function */
            f = fvalue(func);
        Cfunc:
        {
            int n;  /* number of returns */
            checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
            ci = next_ci(L);  /* now 'enter' new function */
            ci->nresults = nresults;
            ci->func = func;
            ci->top = L->top + LUA_MINSTACK;
            lua_assert(ci->top <= L->stack_last);
            ci->callstatus = 0;
            if (L->hookmask & LUA_MASKCALL)
                luaD_hook(L, LUA_HOOKCALL, -1);
            lua_unlock(L);
            n = (*f)(L);  /* do the actual call */
            lua_lock(L);
            api_checknelems(L, n);
            luaD_poscall(L, ci, L->top - n, n);
            return 1;
        }
        case LUA_TLCL: {  /* Lua function: prepare its call */
            StkId base;
            Proto *p = clLvalue(func)->p;
            int n = cast_int(L->top - func) - 1;  /* number of real arguments */
            int fsize = p->maxstacksize;  /* frame size */
            checkstackp(L, fsize, func);
            if (p->is_vararg)
                base = adjust_varargs(L, p, n);
            else {  /* non vararg function */
                for (; n < p->numparams; n++)
                    setnilvalue(L->top++);  /* complete missing arguments */
                base = func + 1;
            }
            ci = next_ci(L);  /* now 'enter' new function */
            ci->nresults = nresults;
            ci->func = func;
            ci->u.l.base = base;
            L->top = ci->top = base + fsize;
            lua_assert(ci->top <= L->stack_last);
            ci->u.l.savedpc = p->code;  /* starting point */
            ci->callstatus = CIST_LUA;
            if (L->hookmask & LUA_MASKCALL)
                callhook(L, ci);
            return 0;
        }
        default: {  /* not a function */
            checkstackp(L, 1, func);  /* ensure space for metamethod */
            tryfuncTM(L, func);  /* try to get '__call' metamethod */
            return luaD_precall(L, func, nresults);  /* now it must be a function */
        }
    }
}